

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

void VP8LRefsCursorNextBlock(VP8LRefsCursor *c)

{
  PixOrCopyBlock *pPVar1;
  PixOrCopy *pPVar2;
  PixOrCopy *pPVar3;
  
  pPVar1 = c->cur_block->next;
  if (pPVar1 == (PixOrCopyBlock *)0x0) {
    pPVar2 = (PixOrCopy *)0x0;
    pPVar3 = (PixOrCopy *)0x0;
  }
  else {
    pPVar2 = pPVar1->start;
    pPVar3 = pPVar2 + pPVar1->size;
  }
  c->cur_pos = pPVar2;
  c->last_pos = pPVar3;
  c->cur_block = pPVar1;
  return;
}

Assistant:

void VP8LRefsCursorNextBlock(VP8LRefsCursor* const c) {
  PixOrCopyBlock* const b = c->cur_block->next;
  c->cur_pos = (b == NULL) ? NULL : b->start;
  c->last_pos = (b == NULL) ? NULL : b->start + b->size;
  c->cur_block = b;
}